

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O2

REF_STATUS
ref_swap_node23(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT *node2,REF_INT *node3)

{
  REF_CELL ref_cell;
  REF_NODE ref_node;
  uint uVar1;
  REF_INT RVar2;
  undefined8 uVar3;
  uint uVar4;
  REF_GRID ref_grid_00;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  REF_INT cell_to_swap [2];
  REF_INT ncell;
  REF_GRID local_c0;
  REF_INT nodes [27];
  REF_DBL normal [3];
  
  ref_cell = ref_grid->cell[3];
  *node2 = -1;
  *node3 = -1;
  uVar1 = ref_cell_list_with2(ref_cell,node0,node1,2,&ncell,cell_to_swap);
  if (uVar1 == 0) {
    local_c0 = ref_grid;
    if ((long)ncell != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0xfe,
             "ref_swap_node23","there should be two triangles for manifold",2,(long)ncell);
      return 1;
    }
    uVar1 = ref_cell_nodes(ref_cell,cell_to_swap[0],nodes);
    if (uVar1 == 0) {
      uVar1 = nodes[0] ^ node0;
      uVar4 = nodes[1] ^ node1;
      if (uVar1 == 0 && uVar4 == 0) {
        *node2 = nodes[2];
      }
      uVar5 = nodes[2] ^ node1;
      uVar7 = nodes[2] ^ node0;
      uVar8 = nodes[0] ^ node1;
      if ((nodes[1] ^ node0) == 0 && uVar5 == 0 || uVar8 == 0 && uVar7 == 0) {
        RVar2 = nodes[0];
        if (uVar8 == 0 && uVar7 == 0) {
          RVar2 = nodes[1];
        }
        *node2 = RVar2;
      }
      if (((uVar1 == 0 && uVar5 == 0) || (uVar8 == 0 && (nodes[1] ^ node0) == 0)) ||
         (uVar4 == 0 && uVar7 == 0)) {
        RVar2 = nodes[2];
        if (uVar4 == 0 && uVar7 == 0) {
          RVar2 = nodes[0];
        }
        if (uVar1 == 0 && uVar5 == 0) {
          RVar2 = nodes[1];
        }
        *node3 = RVar2;
      }
      uVar1 = ref_cell_nodes(ref_cell,cell_to_swap[1],nodes);
      if (uVar1 == 0) {
        uVar1 = nodes[0] ^ node0;
        uVar4 = nodes[1] ^ node1;
        if (uVar1 == 0 && uVar4 == 0) {
          *node2 = nodes[2];
        }
        uVar5 = nodes[2] ^ node1;
        uVar7 = nodes[2] ^ node0;
        uVar8 = nodes[0] ^ node1;
        if ((nodes[1] ^ node0) == 0 && uVar5 == 0 || uVar8 == 0 && uVar7 == 0) {
          RVar2 = nodes[0];
          if (uVar8 == 0 && uVar7 == 0) {
            RVar2 = nodes[1];
          }
          *node2 = RVar2;
        }
        if (((uVar1 == 0 && uVar5 == 0) || (uVar8 == 0 && (nodes[1] ^ node0) == 0)) ||
           (uVar4 == 0 && uVar7 == 0)) {
          RVar2 = nodes[2];
          if (uVar4 == 0 && uVar7 == 0) {
            RVar2 = nodes[0];
          }
          if (uVar1 == 0 && uVar5 == 0) {
            RVar2 = nodes[1];
          }
          *node3 = RVar2;
        }
        if (*node2 == -1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 0x124,"ref_swap_node23","node2 not found");
          ref_grid_00 = local_c0;
          ref_node = local_c0->node;
          ref_node_location(ref_node,node0);
          ref_node_location(ref_grid_00->node,node1);
          printf("node2 %d node3 %d\n",(ulong)(uint)*node2,(ulong)(uint)*node3);
          ref_cell_nodes(ref_cell,cell_to_swap[0],nodes);
          ref_node_tri_normal(ref_node,nodes,normal);
          printf("cell %d node %d %d %d %d %f\n",normal[1],(ulong)(uint)cell_to_swap[0],
                 (ulong)(uint)nodes[0],(ulong)(uint)nodes[1],(ulong)(uint)nodes[2],
                 (ulong)(uint)nodes[3]);
          ref_node_location(ref_grid_00->node,nodes[0]);
          ref_node_location(ref_grid_00->node,nodes[1]);
          ref_node_location(ref_grid_00->node,nodes[2]);
          ref_cell_nodes(ref_cell,cell_to_swap[1],nodes);
          ref_node_tri_normal(ref_node,nodes,normal);
          printf("cell %d node %d %d %d %d %f\n",normal[1],(ulong)(uint)cell_to_swap[1],
                 (ulong)(uint)nodes[0],(ulong)(uint)nodes[1],(ulong)(uint)nodes[2],
                 (ulong)(uint)nodes[3]);
          ref_node_location(ref_grid_00->node,nodes[0]);
          ref_node_location(ref_grid_00->node,nodes[1]);
          ref_node_location(ref_grid_00->node,nodes[2]);
        }
        else {
          if (*node3 != -1) {
            return 0;
          }
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 0x136,"ref_swap_node23","node3 not found");
          ref_grid_00 = local_c0;
          ref_node_location(local_c0->node,node0);
          ref_node_location(ref_grid_00->node,node1);
          printf("node2 %d node3 %d\n",(ulong)(uint)*node2,(ulong)(uint)*node3);
          ref_cell_nodes(ref_cell,cell_to_swap[0],nodes);
          printf("cell %d node %d %d %d %d\n",(ulong)(uint)cell_to_swap[0],(ulong)(uint)nodes[0],
                 (ulong)(uint)nodes[1],(ulong)(uint)nodes[2],(ulong)(uint)nodes[3]);
          ref_node_location(ref_grid_00->node,nodes[0]);
          ref_node_location(ref_grid_00->node,nodes[1]);
          ref_node_location(ref_grid_00->node,nodes[2]);
          ref_cell_nodes(ref_cell,cell_to_swap[1],nodes);
          printf("cell %d node %d %d %d %d\n",(ulong)(uint)cell_to_swap[1],(ulong)(uint)nodes[0],
                 (ulong)(uint)nodes[1],(ulong)(uint)nodes[2],(ulong)(uint)nodes[3]);
          ref_node_location(ref_grid_00->node,nodes[0]);
          ref_node_location(ref_grid_00->node,nodes[1]);
          ref_node_location(ref_grid_00->node,nodes[2]);
        }
        ref_export_by_extension(ref_grid_00,"ref_swap_node23.tec");
        return 1;
      }
      pcVar6 = "nodes tri0";
      uVar3 = 0x107;
    }
    else {
      pcVar6 = "nodes tri0";
      uVar3 = 0x100;
    }
  }
  else {
    pcVar6 = "more then two";
    uVar3 = 0xfd;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",uVar3,
         "ref_swap_node23",(ulong)uVar1,pcVar6);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_swap_node23(REF_GRID ref_grid, REF_INT node0,
                                   REF_INT node1, REF_INT *node2,
                                   REF_INT *node3) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT ncell, cell_to_swap[2];
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  *node2 = REF_EMPTY;
  *node3 = REF_EMPTY;
  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cell_to_swap),
      "more then two");
  REIS(2, ncell, "there should be two triangles for manifold");

  RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes tri0");
  if (node0 == nodes[0] && node1 == nodes[1]) *node2 = nodes[2];
  if (node0 == nodes[1] && node1 == nodes[2]) *node2 = nodes[0];
  if (node0 == nodes[2] && node1 == nodes[0]) *node2 = nodes[1];
  if (node1 == nodes[0] && node0 == nodes[1]) *node3 = nodes[2];
  if (node1 == nodes[1] && node0 == nodes[2]) *node3 = nodes[0];
  if (node1 == nodes[2] && node0 == nodes[0]) *node3 = nodes[1];
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[1], nodes), "nodes tri0");
  if (node0 == nodes[0] && node1 == nodes[1]) *node2 = nodes[2];
  if (node0 == nodes[1] && node1 == nodes[2]) *node2 = nodes[0];
  if (node0 == nodes[2] && node1 == nodes[0]) *node2 = nodes[1];
  if (node1 == nodes[0] && node0 == nodes[1]) *node3 = nodes[2];
  if (node1 == nodes[1] && node0 == nodes[2]) *node3 = nodes[0];
  if (node1 == nodes[2] && node0 == nodes[0]) *node3 = nodes[1];

  RUB(REF_EMPTY, *node2, "node2 not found", {
    REF_DBL normal[3];
    REF_NODE ref_node = ref_grid_node(ref_grid);
    ref_node_location(ref_grid_node(ref_grid), node0);
    ref_node_location(ref_grid_node(ref_grid), node1);
    printf("node2 %d node3 %d\n", *node2, *node3);
    ref_cell_nodes(ref_cell, cell_to_swap[0], nodes);
    ref_node_tri_normal(ref_node, nodes, normal);
    printf("cell %d node %d %d %d %d %f\n", cell_to_swap[0], nodes[0], nodes[1],
           nodes[2], nodes[3], normal[1]);
    ref_node_location(ref_grid_node(ref_grid), nodes[0]);
    ref_node_location(ref_grid_node(ref_grid), nodes[1]);
    ref_node_location(ref_grid_node(ref_grid), nodes[2]);
    ref_cell_nodes(ref_cell, cell_to_swap[1], nodes);
    ref_node_tri_normal(ref_node, nodes, normal);
    printf("cell %d node %d %d %d %d %f\n", cell_to_swap[1], nodes[0], nodes[1],
           nodes[2], nodes[3], normal[1]);
    ref_node_location(ref_grid_node(ref_grid), nodes[0]);
    ref_node_location(ref_grid_node(ref_grid), nodes[1]);
    ref_node_location(ref_grid_node(ref_grid), nodes[2]);
    ref_export_by_extension(ref_grid, "ref_swap_node23.tec");
  });
  RUB(REF_EMPTY, *node3, "node3 not found", {
    ref_node_location(ref_grid_node(ref_grid), node0);
    ref_node_location(ref_grid_node(ref_grid), node1);
    printf("node2 %d node3 %d\n", *node2, *node3);
    ref_cell_nodes(ref_cell, cell_to_swap[0], nodes);
    printf("cell %d node %d %d %d %d\n", cell_to_swap[0], nodes[0], nodes[1],
           nodes[2], nodes[3]);
    ref_node_location(ref_grid_node(ref_grid), nodes[0]);
    ref_node_location(ref_grid_node(ref_grid), nodes[1]);
    ref_node_location(ref_grid_node(ref_grid), nodes[2]);
    ref_cell_nodes(ref_cell, cell_to_swap[1], nodes);
    printf("cell %d node %d %d %d %d\n", cell_to_swap[1], nodes[0], nodes[1],
           nodes[2], nodes[3]);
    ref_node_location(ref_grid_node(ref_grid), nodes[0]);
    ref_node_location(ref_grid_node(ref_grid), nodes[1]);
    ref_node_location(ref_grid_node(ref_grid), nodes[2]);
    ref_export_by_extension(ref_grid, "ref_swap_node23.tec");
  });

  return REF_SUCCESS;
}